

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.cpp
# Opt level: O3

void node_click_proc(Am_Object *command)

{
  int iVar1;
  int iVar2;
  Am_Value *pAVar3;
  Am_Wrapper *pAVar4;
  int *piVar5;
  int iVar6;
  ushort key;
  int iVar7;
  long lVar8;
  Am_Object nodes;
  Am_Object lines;
  Am_Object node;
  Am_Object inter;
  Am_Value_List parents;
  Am_Object aAStack_48 [8];
  Am_Object local_40 [8];
  Am_Object local_38 [8];
  Am_Object local_30 [8];
  Am_Value_List local_28 [16];
  
  Am_Object::Get_Object((ushort)local_30,(ulong)command);
  pAVar3 = (Am_Value *)Am_Object::Get((ushort)local_30,0x11a);
  Am_Object::Am_Object(local_38,pAVar3);
  pAVar3 = (Am_Value *)Am_Object::Get((ushort)local_38,0x85);
  iVar2 = Am_Value::operator_cast_to_int(pAVar3);
  piVar5 = tree + iVar2;
  iVar1 = *piVar5;
  iVar7 = iVar2;
  if (*piVar5 != iVar2) {
    do {
      iVar6 = iVar1;
      *piVar5 = iVar2;
      piVar5 = tree + iVar6;
      iVar2 = iVar7;
      iVar1 = *piVar5;
      iVar7 = iVar6;
    } while (*piVar5 != iVar6);
  }
  *piVar5 = iVar2;
  Am_Value_List::Am_Value_List(local_28);
  lVar8 = 0;
  do {
    Am_Value_List::Add(local_28,*(undefined4 *)((long)tree + lVar8),1,1);
    lVar8 = lVar8 + 4;
  } while (lVar8 != 0x28);
  key = (ushort)aAStack_48;
  Am_Object::Get_Object(key,(ulong)local_30);
  Am_Object::Get_Sibling(local_40,key,(ulong)LINES);
  pAVar4 = Am_Value_List::operator_cast_to_Am_Wrapper_(local_28);
  Am_Object::Set(key,(Am_Wrapper *)0xa2,(ulong)pAVar4);
  pAVar4 = Am_Value_List::operator_cast_to_Am_Wrapper_(local_28);
  Am_Object::Set((ushort)local_40,(Am_Wrapper *)0xa2,(ulong)pAVar4);
  Am_Object::~Am_Object(local_40);
  Am_Object::~Am_Object(aAStack_48);
  Am_Value_List::~Am_Value_List(local_28);
  Am_Object::~Am_Object(local_38);
  Am_Object::~Am_Object(local_30);
  return;
}

Assistant:

Am_Define_Method(Am_Object_Method, void, node_click, (Am_Object command))
{
  Am_Object inter = command.Get_Owner();
  Am_Object node = inter.Get(Am_START_OBJECT);
  int rank = node.Get(Am_RANK);
  int prev_rank = rank;
  int next_rank = tree[rank];
  while (next_rank != rank) {
    tree[rank] = prev_rank;
    prev_rank = rank;
    rank = next_rank;
    next_rank = tree[rank];
  }
  tree[rank] = prev_rank;

  int i;
  Am_Value_List parents;
  for (i = 0; i < 10; ++i)
    parents.Add(tree[i]);
  Am_Object nodes = inter.Get_Owner();
  Am_Object lines = nodes.Get_Sibling(LINES);
  nodes.Set(Am_ITEMS, parents);
  lines.Set(Am_ITEMS, parents);
}